

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# damagebintocsv.cpp
# Opt level: O1

void damagebintocsv::doit(bool intervalType)

{
  size_t sVar1;
  undefined7 in_register_00000039;
  damagebindictionary q;
  uint local_3c;
  float local_38;
  float local_34;
  float local_30;
  uint local_2c;
  
  printf("\"bin_index\", \"bin_from\", \"bin_to\", \"interpolation\"");
  if ((int)CONCAT71(in_register_00000039,intervalType) != 0) {
    printf(", \"interval_type\"");
  }
  putchar(10);
  sVar1 = fread(&local_3c,0x14,1,_stdin);
  if (sVar1 != 0) {
    do {
      printf("%d, %f, %f, %f",(double)local_38,(double)local_34,(double)local_30,(ulong)local_3c);
      if (intervalType) {
        printf(", %d",(ulong)local_2c);
      }
      putchar(10);
      sVar1 = fread(&local_3c,0x14,1,_stdin);
    } while (sVar1 != 0);
  }
  return;
}

Assistant:

void doit(bool intervalType)
	{
		printf("\"bin_index\", \"bin_from\", \"bin_to\", \"interpolation\"");
		if (intervalType) printf(", \"interval_type\"");
		printf("\n");

		damagebindictionary q;
		size_t i = fread(&q, sizeof(q), 1, stdin);
		while (i != 0) {
			printf("%d, %f, %f, %f",
				q.bin_index, q.bin_from, q.bin_to, q.interpolation);
			if (intervalType) printf(", %d", q.interval_type);
			printf("\n");

			i = fread(&q, sizeof(q), 1, stdin);
		}

	}